

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

char __thiscall
ModbusSimulationDataGenerator::BinToLATIN1(ModbusSimulationDataGenerator *this,U8 value)

{
  U8 value_local;
  ModbusSimulationDataGenerator *this_local;
  
  switch(value) {
  case '\0':
    this_local._7_1_ = '0';
    break;
  case '\x01':
    this_local._7_1_ = '1';
    break;
  case '\x02':
    this_local._7_1_ = '2';
    break;
  case '\x03':
    this_local._7_1_ = '3';
    break;
  case '\x04':
    this_local._7_1_ = '4';
    break;
  case '\x05':
    this_local._7_1_ = '5';
    break;
  case '\x06':
    this_local._7_1_ = '6';
    break;
  case '\a':
    this_local._7_1_ = '7';
    break;
  case '\b':
    this_local._7_1_ = '8';
    break;
  case '\t':
    this_local._7_1_ = '9';
    break;
  case '\n':
    this_local._7_1_ = 'A';
    break;
  case '\v':
    this_local._7_1_ = 'B';
    break;
  case '\f':
    this_local._7_1_ = 'C';
    break;
  case '\r':
    this_local._7_1_ = 'D';
    break;
  case '\x0e':
    this_local._7_1_ = 'E';
    break;
  case '\x0f':
    this_local._7_1_ = 'F';
    break;
  default:
    this_local._7_1_ = '0';
  }
  return this_local._7_1_;
}

Assistant:

char ModbusSimulationDataGenerator::BinToLATIN1( U8 value )
{
    switch( value )
    {
    case 0:
        return '0';
    case 1:
        return '1';
    case 2:
        return '2';
    case 3:
        return '3';
    case 4:
        return '4';
    case 5:
        return '5';
    case 6:
        return '6';
    case 7:
        return '7';
    case 8:
        return '8';
    case 9:
        return '9';
    case 0xA:
        return 'A';
    case 0xB:
        return 'B';
    case 0xC:
        return 'C';
    case 0xD:
        return 'D';
    case 0xE:
        return 'E';
    case 0xF:
        return 'F';
    default:
        return '0';
    }
}